

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uo_http_server.c
# Opt level: O3

void tcp_server_evt_handler_before_close(uo_cb *cb)

{
  uo_tcp_conn *tcp_conn;
  void *item;
  
  tcp_conn = (uo_tcp_conn *)uo_cb_stack_pop(cb);
  item = uo_tcp_conn_get_user_data(tcp_conn,"http_conn");
  uo_cb_stack_push(cb,item);
  uo_cb_prepend_func(cb,uo_http_conn_pass_cb_to_tcp_server);
  uo_cb_prepend_cb(cb,*(uo_cb **)(*(long *)((long)item + 0x198) + 0x28));
  uo_cb_invoke(cb);
  return;
}

Assistant:

static void tcp_server_evt_handler_before_close(
    uo_cb *cb)
{
    uo_tcp_conn *tcp_conn = uo_cb_stack_pop(cb);
    uo_http_conn *http_conn = uo_tcp_conn_get_user_data(tcp_conn, "http_conn");

    uo_cb_stack_push(cb, http_conn);

    uo_cb_prepend(cb, uo_http_conn_pass_cb_to_tcp_server);
    uo_cb_prepend(cb, http_conn->evt_handlers->before_close);

    uo_cb_invoke(cb);
}